

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O0

void initialize_testing(char *test_name)

{
  long *in_FS_OFFSET;
  
  list_initialize((ListNode *)(*in_FS_OFFSET + -400));
  initialize_source_location((SourceLocation *)0x189d25);
  list_initialize((ListNode *)(*in_FS_OFFSET + -0x140));
  initialize_source_location((SourceLocation *)0x189d55);
  list_initialize((ListNode *)(*in_FS_OFFSET + -0x160));
  initialize_source_location((SourceLocation *)0x189d85);
  return;
}

Assistant:

void initialize_testing(const char *test_name) {
    (void)test_name;
    list_initialize(&global_function_result_map_head);
    initialize_source_location(&global_last_mock_value_location);
    list_initialize(&global_function_parameter_map_head);
    initialize_source_location(&global_last_parameter_location);
    list_initialize(&global_call_ordering_head);
    initialize_source_location(&global_last_parameter_location);
}